

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManBuildFromMiniInt(Gia_Man_t *pNew,Vec_Int_t *vLeaves,Vec_Int_t *vAig,int fHash)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  int i;
  
  iVar1 = vAig->nSize;
  uVar6 = (ulong)iVar1;
  if ((long)uVar6 < 1) {
    __assert_fail("Vec_IntSize(vAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x34b,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  if (1 < vAig->pArray[uVar6 - 1]) {
    __assert_fail("Vec_IntEntryLast(vAig) < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x34c,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  if (iVar1 != 2) {
    if (iVar1 == 1) {
      iVar1 = Vec_IntEntry(vAig,0);
      return iVar1;
    }
    if ((uVar6 & 1) != 0) {
      iVar1 = vLeaves->nSize;
      i = 0;
      iVar7 = 0;
      while( true ) {
        if ((int)uVar6 <= i + 1) break;
        iVar2 = Vec_IntEntry(vAig,i);
        iVar3 = Vec_IntEntry(vAig,i + 1);
        iVar4 = Abc_Lit2Var(iVar2);
        iVar5 = Abc_Lit2Var(iVar3);
        iVar7 = iVar4 - iVar1;
        pVVar8 = vAig;
        if (iVar4 < iVar1) {
          pVVar8 = vLeaves;
          iVar7 = iVar4;
        }
        iVar7 = Vec_IntEntry(pVVar8,iVar7);
        iVar2 = Abc_LitIsCompl(iVar2);
        iVar7 = Abc_LitNotCond(iVar7,iVar2);
        iVar2 = iVar5 - iVar1;
        pVVar8 = vAig;
        if (iVar5 < iVar1) {
          pVVar8 = vLeaves;
          iVar2 = iVar5;
        }
        iVar2 = Vec_IntEntry(pVVar8,iVar2);
        iVar3 = Abc_LitIsCompl(iVar3);
        iVar2 = Abc_LitNotCond(iVar2,iVar3);
        if (fHash == 0) {
          if (iVar7 != iVar2) {
            iVar7 = Gia_ManAppendAnd(pNew,iVar7,iVar2);
          }
        }
        else {
          iVar7 = Gia_ManHashAnd(pNew,iVar7,iVar2);
        }
        iVar2 = Abc_Lit2Var(i);
        Vec_IntWriteEntry(vAig,iVar2,iVar7);
        i = i + 2;
        uVar6 = (ulong)(uint)vAig->nSize;
      }
      if (i != (int)uVar6 + -1) {
        __assert_fail("i == Vec_IntSize(vAig) - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                      ,0x369,
                      "int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
      }
      iVar1 = Vec_IntEntry(vAig,i);
      iVar1 = Abc_LitNotCond(iVar7,iVar1);
      vAig->nSize = 0;
      return iVar1;
    }
    __assert_fail("Vec_IntSize(vAig) & 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x359,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  iVar1 = Vec_IntEntry(vAig,0);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntEntry(vAig, 0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x351,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  if (vLeaves->nSize != 1) {
    __assert_fail("Vec_IntSize(vLeaves) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x352,"int Gia_ManBuildFromMiniInt(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  iVar1 = Vec_IntEntry(vLeaves,0);
  iVar7 = Vec_IntEntry(vAig,1);
  iVar1 = Abc_LitNotCond(iVar1,iVar7);
  return iVar1;
}

Assistant:

int Gia_ManBuildFromMiniInt( Gia_Man_t * pNew, Vec_Int_t * vLeaves, Vec_Int_t * vAig, int fHash )
{
    assert( Vec_IntSize(vAig) > 0 );
    assert( Vec_IntEntryLast(vAig) < 2 );
    if ( Vec_IntSize(vAig) == 1 ) // const
        return Vec_IntEntry(vAig, 0);
    if ( Vec_IntSize(vAig) == 2 ) // variable
    {
        assert( Vec_IntEntry(vAig, 0) == 0 );
        assert( Vec_IntSize(vLeaves) == 1 );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, 0), Vec_IntEntry(vAig, 1) );
    }
    else
    {
        int nLeaves = Vec_IntSize(vLeaves);
        int i, iVar0, iVar1, iLit0, iLit1, iLit = 0;
        assert( Vec_IntSize(vAig) & 1 );
        Vec_IntForEachEntryDouble( vAig, iLit0, iLit1, i )
        {
            iVar0 = Abc_Lit2Var( iLit0 );
            iVar1 = Abc_Lit2Var( iLit1 );
            iLit0 = Abc_LitNotCond( iVar0 < nLeaves ? Vec_IntEntry(vLeaves, iVar0) : Vec_IntEntry(vAig, iVar0 - nLeaves), Abc_LitIsCompl(iLit0) );
            iLit1 = Abc_LitNotCond( iVar1 < nLeaves ? Vec_IntEntry(vLeaves, iVar1) : Vec_IntEntry(vAig, iVar1 - nLeaves), Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLit = Gia_ManHashAnd( pNew, iLit0, iLit1 );
            else if ( iLit0 == iLit1 )
                iLit = iLit0;
            else
                iLit = Gia_ManAppendAnd( pNew, iLit0, iLit1 );
            assert( (i & 1) == 0 );
            Vec_IntWriteEntry( vAig, Abc_Lit2Var(i), iLit );  // overwriting entries
        }
        assert( i == Vec_IntSize(vAig) - 1 );
        iLit = Abc_LitNotCond( iLit, Vec_IntEntry(vAig, i) );
        Vec_IntClear( vAig ); // useless
        return iLit;
    }
}